

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::gather_big<std::pair<int,double>>
               (pair<int,_double> *data,size_t size,pair<int,_double> *out,int root,comm *comm)

{
  datatype dt;
  datatype dt_1;
  
  dt_1.mpitype = datatype_builder<std::pair<int,_double>_>::get_type();
  dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00180c80;
  dt_1.builtin = false;
  datatype::contiguous(&dt,&dt_1,size);
  datatype::~datatype(&dt_1);
  MPI_Gather(data,1,dt.mpitype,out,1,dt.mpitype,root,comm->mpi_comm);
  datatype::~datatype(&dt);
  return;
}

Assistant:

void gather_big(const T* data, size_t size, T* out, int root, const mxx::comm& comm) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Gather(const_cast<T*>(data), 1, dt.type(), out, 1, dt.type(), root, comm);
}